

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_implied_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b7ec4::NopImpliedFixture_nop_implied_Test::~NopImpliedFixture_nop_implied_Test
          (NopImpliedFixture_nop_implied_Test *this)

{
  NopImpliedFixture_nop_implied_Test *this_local;
  
  ~NopImpliedFixture_nop_implied_Test(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TEST_P(NopImpliedFixture, nop_implied) {
    stage_instruction(GetParam());

    step_execution(2);
    EXPECT_EQ(expected, registers);
}